

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::WriteMessage
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Type *type,StringPiece name,
          uint32 end_tag,bool include_start_and_end,ObjectWriter *ow)

{
  key_type *__k;
  CodedInputStream *pCVar1;
  byte *pbVar2;
  bool bVar3;
  iterator iVar4;
  Field *field;
  ProtoStreamObjectSource *pPVar5;
  pointer pUVar6;
  pointer pUVar7;
  UnknownFieldSet *unknown_fields_00;
  CodedInputStream *input;
  pointer pcVar8;
  _Alloc_hider _Var9;
  uint first_byte_or_zero;
  StringPiece name_00;
  StatusOr<unsigned_int> local_f0;
  Status local_c0;
  uint32 local_98;
  Type *local_90;
  undefined1 auStack_88 [8];
  UnknownFieldSet unknown_fields;
  string field_name;
  uint local_48;
  
  pcVar8 = (pointer)name.length_;
  __k = (type->name_).ptr_;
  _Var9._M_p = pcVar8;
  std::call_once<void(&)()>((once_flag *)&source_renderers_init_,InitRendererMap);
  input = renderers__abi_cxx11_;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)renderers__abi_cxx11_,__k);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_true>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_true>
                       ._M_cur + 0x28))(__return_storage_ptr__,this,type,name.ptr_,pcVar8,ow);
    return __return_storage_ptr__;
  }
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&field_name._M_string_length;
  field_name._M_dataplus._M_p = (pointer)0x0;
  field_name._M_string_length._0_1_ = 0;
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  pPVar5 = this;
  local_90 = type;
  if (pbVar2 < pCVar1->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar1->buffer_ = pbVar2 + 1;
      goto LAB_00320cbf;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  input = pCVar1;
  first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
LAB_00320cbf:
  pCVar1->last_tag_ = first_byte_or_zero;
  auStack_88 = (undefined1  [8])0x0;
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((pcVar8 == (pointer)0x0) || (first_byte_or_zero != end_tag)) ||
     (this->suppress_empty_object_ != true)) {
    if (include_start_and_end) {
      input = (CodedInputStream *)ow;
      (*ow->_vptr_ObjectWriter[2])(ow,name.ptr_,pcVar8);
    }
    pUVar6 = (pointer)CONCAT71((int7)((ulong)pPVar5 >> 8),
                               first_byte_or_zero == 0 || first_byte_or_zero == end_tag);
    if (first_byte_or_zero != 0 && first_byte_or_zero != end_tag) {
      local_48 = first_byte_or_zero + 1;
      field_name.field_2._8_8_ = &(__return_storage_ptr__->error_message_).field_2;
      field = (Field *)0x0;
      do {
        pUVar7 = pUVar6;
        pcVar8 = _Var9._M_p;
        if (first_byte_or_zero != local_48) {
          field = FindAndVerifyField((ProtoStreamObjectSource *)input,local_90,first_byte_or_zero);
          local_48 = first_byte_or_zero;
          if (field == (Field *)0x0) {
            field = (Field *)0x0;
            pUVar7 = pUVar6;
            pcVar8 = _Var9._M_p;
          }
          else {
            std::__cxx11::string::_M_assign
                      ((string *)
                       &unknown_fields.fields_.
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pUVar7 = pUVar6;
            pcVar8 = _Var9._M_p;
          }
        }
        _Var9._M_p = field_name._M_dataplus._M_p;
        pUVar6 = unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (field == (Field *)0x0) {
          input = this->stream_;
          unknown_fields_00 = (UnknownFieldSet *)0x0;
          if (this->render_unknown_fields_ != false) {
            unknown_fields_00 = (UnknownFieldSet *)auStack_88;
          }
          protobuf::internal::WireFormat::SkipField(input,first_byte_or_zero,unknown_fields_00);
          pCVar1 = this->stream_;
          pbVar2 = pCVar1->buffer_;
          if (pbVar2 < pCVar1->buffer_end_) {
            first_byte_or_zero = (uint)*pbVar2;
            if ((char)*pbVar2 < '\0') goto LAB_00320fa0;
            pCVar1->buffer_ = pbVar2 + 1;
            pUVar6 = pUVar7;
            _Var9._M_p = pcVar8;
          }
          else {
            first_byte_or_zero = 0;
LAB_00320fa0:
            input = pCVar1;
            first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
            pUVar6 = pUVar7;
            _Var9._M_p = pcVar8;
          }
          pCVar1->last_tag_ = first_byte_or_zero;
          field = (Field *)0x0;
        }
        else if (field->cardinality_ == 3) {
          bVar3 = IsMap(this,field);
          _Var9 = field_name._M_dataplus;
          pUVar6 = unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar3) {
            if ((long)field_name._M_dataplus._M_p < 0) {
              StringPiece::LogFatalSizeTooBig
                        ((size_t)field_name._M_dataplus._M_p,"size_t to int conversion");
            }
            (*ow->_vptr_ObjectWriter[2])(ow,pUVar6,_Var9._M_p);
            pUVar6 = pUVar7;
            _Var9._M_p = pcVar8;
            if ((long)field_name._M_dataplus._M_p < 0) {
              StringPiece::LogFatalSizeTooBig
                        ((size_t)field_name._M_dataplus._M_p,"size_t to int conversion");
              pUVar6 = pUVar7;
              _Var9._M_p = pcVar8;
            }
            name_00.length_ = (stringpiece_ssize_type)_Var9._M_p;
            name_00.ptr_ = (char *)pUVar6;
            RenderMap(&local_f0,this,field,name_00,first_byte_or_zero,ow);
            if (local_f0.status_.error_code_ == OK) {
              first_byte_or_zero = local_f0.value_;
            }
            Status::Status(__return_storage_ptr__,&local_f0.status_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0.status_.error_message_._M_dataplus._M_p !=
                &local_f0.status_.error_message_.field_2) {
              operator_delete(local_f0.status_.error_message_._M_dataplus._M_p);
            }
            if (__return_storage_ptr__->error_code_ != OK) goto LAB_00320ff7;
            (*ow->_vptr_ObjectWriter[3])();
          }
          else {
            if ((long)field_name._M_dataplus._M_p < 0) {
              StringPiece::LogFatalSizeTooBig
                        ((size_t)field_name._M_dataplus._M_p,"size_t to int conversion");
            }
            (*(this->super_ObjectSource)._vptr_ObjectSource[5])
                      (&local_c0,this,field,pUVar6,_Var9._M_p,(ulong)first_byte_or_zero,ow);
            if (local_c0.error_code_ == OK) {
              first_byte_or_zero = local_98;
            }
            Status::Status(__return_storage_ptr__,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.error_message_._M_dataplus._M_p != &local_c0.error_message_.field_2) {
              operator_delete(local_c0.error_message_._M_dataplus._M_p);
            }
            if (__return_storage_ptr__->error_code_ != OK) goto LAB_00320ff7;
          }
          input = (CodedInputStream *)(__return_storage_ptr__->error_message_)._M_dataplus._M_p;
          if (input != (CodedInputStream *)field_name.field_2._8_8_) {
            operator_delete(input);
          }
        }
        else {
          if ((long)field_name._M_dataplus._M_p < 0) {
            StringPiece::LogFatalSizeTooBig
                      ((size_t)field_name._M_dataplus._M_p,"size_t to int conversion");
          }
          (*(this->super_ObjectSource)._vptr_ObjectSource[6])
                    (__return_storage_ptr__,this,field,pUVar6,_Var9._M_p,ow);
          if (__return_storage_ptr__->error_code_ != OK) goto LAB_00320ff7;
          input = (CodedInputStream *)(__return_storage_ptr__->error_message_)._M_dataplus._M_p;
          if (input != (CodedInputStream *)field_name.field_2._8_8_) {
            operator_delete(input);
          }
          pCVar1 = this->stream_;
          pbVar2 = pCVar1->buffer_;
          if (pbVar2 < pCVar1->buffer_end_) {
            first_byte_or_zero = (uint)*pbVar2;
            if ((char)*pbVar2 < '\0') goto LAB_00320fba;
            pCVar1->buffer_ = pbVar2 + 1;
          }
          else {
            first_byte_or_zero = 0;
LAB_00320fba:
            input = pCVar1;
            first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar1,first_byte_or_zero);
          }
          pCVar1->last_tag_ = first_byte_or_zero;
        }
      } while ((first_byte_or_zero != end_tag) && (first_byte_or_zero != 0));
    }
    if (include_start_and_end) {
      (*ow->_vptr_ObjectWriter[3])();
    }
  }
  Status::Status(__return_storage_ptr__);
LAB_00320ff7:
  if (auStack_88 !=
      (undefined1  [8])
      unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    UnknownFieldSet::ClearFallback((UnknownFieldSet *)auStack_88);
  }
  if (auStack_88 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_88);
  }
  if (unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&field_name._M_string_length) {
    operator_delete(unknown_fields.fields_.
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::WriteMessage(const google::protobuf::Type& type,
                                             StringPiece name,
                                             const uint32 end_tag,
                                             bool include_start_and_end,
                                             ObjectWriter* ow) const {

  const TypeRenderer* type_renderer = FindTypeRenderer(type.name());
  if (type_renderer != nullptr) {
    return (*type_renderer)(this, type, name, ow);
  }

  const google::protobuf::Field* field = nullptr;
  std::string field_name;
  // last_tag set to dummy value that is different from tag.
  uint32 tag = stream_->ReadTag(), last_tag = tag + 1;
  UnknownFieldSet unknown_fields;

  if (!name.empty() && tag == end_tag && suppress_empty_object_) {
    return util::Status();
  }

  if (include_start_and_end) {
    ow->StartObject(name);
  }
  while (tag != end_tag && tag != 0) {
    if (tag != last_tag) {  // Update field only if tag is changed.
      last_tag = tag;
      field = FindAndVerifyField(type, tag);
      if (field != nullptr) {
        if (preserve_proto_field_names_) {
          field_name = field->name();
        } else {
          field_name = field->json_name();
        }
      }
    }
    if (field == nullptr) {
      // If we didn't find a field, skip this unknown tag.
      // TODO(wpoon): Check return boolean value.
      WireFormat::SkipField(stream_, tag,
                            render_unknown_fields_ ? &unknown_fields : nullptr);
      tag = stream_->ReadTag();
      continue;
    }

    if (field->cardinality() == google::protobuf::Field::CARDINALITY_REPEATED) {
      if (IsMap(*field)) {
        ow->StartObject(field_name);
        ASSIGN_OR_RETURN(tag, RenderMap(field, field_name, tag, ow));
        ow->EndObject();
      } else {
        ASSIGN_OR_RETURN(tag, RenderList(field, field_name, tag, ow));
      }
    } else {
      // Render the field.
      RETURN_IF_ERROR(RenderField(field, field_name, ow));
      tag = stream_->ReadTag();
    }
  }


  if (include_start_and_end) {
    ow->EndObject();
  }
  return util::Status();
}